

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_bool spvc_compiler_get_binary_offset_for_decoration
                    (spvc_compiler compiler,spvc_variable_id id,SpvDecoration decoration,
                    uint *word_offset)

{
  bool bVar1;
  pointer this;
  VariableID local_34 [2];
  uint32_t local_2c;
  bool ret;
  uint *puStack_28;
  uint32_t off;
  uint *word_offset_local;
  SpvDecoration decoration_local;
  spvc_variable_id id_local;
  spvc_compiler compiler_local;
  
  local_2c = 0;
  puStack_28 = word_offset;
  word_offset_local._0_4_ = decoration;
  word_offset_local._4_4_ = id;
  _decoration_local = compiler;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::TypedID<(spirv_cross::Types)2>::TypedID(local_34,word_offset_local._4_4_);
  bVar1 = spirv_cross::Compiler::get_binary_offset_for_decoration
                    (this,local_34[0],(Decoration)word_offset_local,&local_2c);
  if (bVar1) {
    *puStack_28 = local_2c;
  }
  return bVar1;
}

Assistant:

spvc_bool spvc_compiler_get_binary_offset_for_decoration(spvc_compiler compiler, spvc_variable_id id,
                                                         SpvDecoration decoration,
                                                         unsigned *word_offset)
{
	uint32_t off = 0;
	bool ret = compiler->compiler->get_binary_offset_for_decoration(id, static_cast<spv::Decoration>(decoration), off);
	if (ret)
	{
		*word_offset = off;
		return SPVC_TRUE;
	}
	else
		return SPVC_FALSE;
}